

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  pointer pPVar2;
  pointer puVar3;
  uint16_t uVar4;
  int iVar5;
  P2PSocket *this;
  Events *pEVar6;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar7;
  Peers *pPVar8;
  ostream *poVar9;
  _Any_data *__a;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  int iVar11;
  pointer puVar12;
  pointer pPVar13;
  ulong uVar14;
  initializer_list<unsigned_short> __l;
  undefined1 local_188 [32];
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> msgs;
  vector<unsigned_short,_std::allocator<unsigned_short>_> knownPorts;
  _Any_data local_138;
  P2PSocket *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  Event local_b0;
  Event local_70;
  
  local_188._0_2_ = 0x22ba;
  __a = (_Any_data *)&msgs;
  __l._M_len = 1;
  __l._M_array = (iterator)local_188;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&knownPorts,__l,(allocator_type *)__a->_M_pod_data);
  this = (P2PSocket *)operator_new(0xb0);
  P2PSocket::P2PSocket(this,2,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,"127.0.0.1",(allocator<char> *)&msgs);
  P2PSocket::createServer(this,(string *)local_188,0x1a66);
  std::__cxx11::string::~string((string *)local_188);
  pEVar6 = P2PSocket::events(this);
  puVar7 = Events::onPeerConnect(pEVar6);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:28:9)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:28:9)>
             ::_M_manager;
  Event::listen(&local_70,
                (int)(puVar7->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_d8);
  Event::~Event(&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  pEVar6 = P2PSocket::events(this);
  puVar7 = Events::onPeerDisconnect(pEVar6);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:30:9)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main2.cpp:30:9)>
             ::_M_manager;
  Event::listen(&local_b0,
                (int)(puVar7->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_f8);
  Event::~Event(&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  uVar14 = (long)knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  signal(0xd,(__sighandler_t)0x1);
  iVar11 = 0;
  uVar10 = extraout_RDX;
  do {
    P2PSocket::listen(this,0,(int)uVar10);
    std::operator<<((ostream *)&std::cout,"listening\n");
    puVar3 = knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar12 = knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
        puVar12 = puVar12 + 1) {
      if (iVar11 < (int)(uVar14 >> 1)) {
        uVar1 = *puVar12;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_188,"127.0.0.1",(allocator<char> *)&msgs);
        P2PSocket::connect(this,(int)(Peers *)local_188,(sockaddr *)(ulong)uVar1,(socklen_t)__a);
        std::__cxx11::string::~string((string *)local_188);
        iVar11 = iVar11 + 1;
      }
    }
    pPVar8 = P2PSocket::peers(this);
    iVar5 = Peers::count(pPVar8);
    if (0 < iVar5) {
      pPVar8 = P2PSocket::peers(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_188,"Broadcasting...",(allocator<char> *)&msgs);
      local_108 = 0;
      uStack_100 = 0;
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      iVar5 = Peers::broadcast(pPVar8,(string *)local_188,
                               (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>
                                *)&local_118);
      std::_Function_base::~_Function_base((_Function_base *)&local_118);
      std::__cxx11::string::~string((string *)local_188);
      poVar9 = std::operator<<((ostream *)&std::cout,"Sent: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
      std::operator<<(poVar9," msgs\n");
      pPVar8 = P2PSocket::peers(this);
      local_128 = (P2PSocket *)0x0;
      uStack_120._0_4_ = 0;
      uStack_120._4_4_ = 0;
      local_138._M_unused._M_object = (_Base_ptr)0x0;
      local_138._8_8_ = 0;
      __a = &local_138;
      Peers::read((Peers *)local_188,(int)pPVar8,(void *)0x400,(size_t)__a);
      PeersMessages::all(&msgs,(PeersMessages *)local_188);
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector
                ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)(local_188 + 8));
      std::_Function_base::~_Function_base((_Function_base *)&local_138);
      pPVar2 = msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar13 = msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                     _M_impl.super__Vector_impl_data._M_start; pPVar13 != pPVar2;
          pPVar13 = pPVar13 + 1) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Recieved message: ");
        std::__cxx11::string::string((string *)local_188,(string *)&pPVar13->m_message);
        poVar9 = std::operator<<(poVar9,(string *)local_188);
        poVar9 = std::operator<<(poVar9," from ");
        uVar4 = Peer::port(pPVar13->m_peer);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar4);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)local_188);
      }
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector(&msgs);
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"Sleeping...");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar11);
    std::operator<<(poVar9,"\n");
    sleep(2);
    uVar10 = extraout_RDX_00;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    std::vector<uint16_t> knownPorts = {
        8890,
    };

    P2PSocket *sock;

    try {
        sock = new P2PSocket(2);
        sock->createServer("127.0.0.1", 6758);
    } catch(P2PSocketException &e) {
        std::cout << e.what() << std::endl;
    }

    sock->events()->onPeerConnect()->listen(
        [](auto &&) { std::cout << "A new peer connected" << std::endl; });
    sock->events()->onPeerDisconnect()->listen(
        [](auto &&) { std::cout << "A peer disconnected" << std::endl; });

    int total = knownPorts.size();
    int connected = 0;
    signal(SIGPIPE, SIG_IGN);

    while (true) {
        try {
            sock->listen();
            std::cout << "listening\n";
        } catch (const P2PSocketException &e) {
            // std::cout << e.what() << std::endl;
        }

        for (auto port : knownPorts) {
            if (connected < total) {
                try {
                    sock->connect("127.0.0.1", port);
                } catch (const P2PSocketException &e) {
                    std::cout << e.what();
                }
                ++connected;
            }
        }

        auto peersCount = sock->peers()->count();

        if (peersCount > 0) {
            try {
                int bytes = sock->peers()->broadcast("Broadcasting...");
                std::cout << "Sent: " << bytes << " msgs\n";
            } catch (...) {
            }
            try {
                auto msgs = sock->peers()->read().all();
                for (const auto &msg : msgs) {
                    std::cout << "Recieved message: " << msg.message() << " from "
                              << msg.peer()->port() << "\n";
                }
            } catch (const PeerException &e) {
                std::cout << "No messages\n";
            }
        }

        std::cout << "Sleeping..." << connected << "\n";
        sleep(2);
    }

    std::cout << "Done, exiting...\n";
    return 0;
}